

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeBindingDivisorTest::CheckXFB
          (AttributeBindingDivisorTest *this,GLuint count,GLint *expected,GLchar *log_message)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar4;
  ulong uVar5;
  GLuint i;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  ulong uVar7;
  ulong uVar8;
  string expected_str;
  string result_str;
  string local_1f0 [32];
  string local_1d0 [32];
  undefined1 local_1b0 [384];
  long lVar3;
  
  uVar8 = (ulong)count;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  lVar4 = (**(code **)(lVar3 + 0xcf8))(0x8c8e,35000);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd41);
  uVar7 = 0;
  do {
    uVar5 = uVar7;
    if (uVar8 == uVar5) goto LAB_00b1d538;
    uVar7 = uVar5 + 1;
  } while (expected[uVar5] == *(int *)(lVar4 + uVar5 * 4));
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"[",(allocator<char> *)local_1b0);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"[",(allocator<char> *)local_1b0);
  uVar6 = extraout_RDX;
  for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
    Utilities::itoa_abi_cxx11_
              ((string *)local_1b0,(Utilities *)(ulong)(uint)expected[uVar7],(GLuint)uVar6);
    std::__cxx11::string::append(local_1f0);
    std::__cxx11::string::~string((string *)local_1b0);
    Utilities::itoa_abi_cxx11_
              ((string *)local_1b0,(Utilities *)(ulong)*(uint *)(lVar4 + uVar7 * 4),i);
    std::__cxx11::string::append(local_1d0);
    std::__cxx11::string::~string((string *)local_1b0);
    if (uVar7 < count - 1) {
      std::__cxx11::string::append((char *)local_1f0);
    }
    else {
      std::__cxx11::string::append((char *)local_1f0);
    }
    std::__cxx11::string::append((char *)local_1d0);
    uVar6 = extraout_RDX_00;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Result is ");
  std::operator<<((ostream *)this_00,local_1d0);
  std::operator<<((ostream *)this_00,", but ");
  std::operator<<((ostream *)this_00,local_1f0);
  std::operator<<((ostream *)this_00," was expected. ");
  std::operator<<((ostream *)this_00,log_message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1f0);
LAB_00b1d538:
  (**(code **)(lVar3 + 0x1670))(0x8c8e);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xd67);
  return uVar8 <= uVar5;
}

Assistant:

bool AttributeBindingDivisorTest::CheckXFB(const glw::GLuint count, const glw::GLint expected[],
										   const glw::GLchar* log_message)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result setup */
	bool is_ok = true;

	/* Result query. */
	glw::GLint* result = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	/* Check result and return. */
	for (glw::GLuint i = 0; i < count; ++i)
	{
		if (expected[i] != result[i])
		{
			std::string expected_str = "[";
			std::string result_str   = "[";

			for (glw::GLuint j = 0; j < count; ++j)
			{
				expected_str.append(Utilities::itoa((glw::GLuint)expected[j]));
				result_str.append(Utilities::itoa((glw::GLuint)result[j]));

				if (j < count - 1)
				{
					expected_str.append(", ");
					result_str.append(", ");
				}
				else
				{
					expected_str.append("]");
					result_str.append("]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result is " << result_str << ", but "
												<< expected_str << " was expected. " << log_message
												<< tcu::TestLog::EndMessage;

			is_ok = false;
			break;
		}
	}

	/* Unmaping GL buffer. */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	return is_ok;
}